

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
          (ArrayWithPreallocation<soul::Identifier,_8UL> *this,
          ArrayWithPreallocation<soul::Identifier,_8UL> *other)

{
  ulong uVar1;
  size_t sVar2;
  size_t sVar3;
  
  this->numActive = 0;
  this->numAllocated = 8;
  uVar1 = other->numAllocated;
  if (8 < uVar1) {
    this->items = other->items;
    this->numActive = other->numActive;
    this->numAllocated = uVar1;
    other->items = (Identifier *)other->space;
    other->numAllocated = 8;
    other->numActive = 0;
    return;
  }
  this->items = (Identifier *)this->space;
  sVar2 = other->numActive;
  this->numActive = sVar2;
  if (sVar2 != 0) {
    sVar3 = 0;
    do {
      this->items[sVar3].name = other->items[sVar3].name;
      sVar3 = sVar3 + 1;
    } while (sVar2 != sVar3);
  }
  return;
}

Assistant:

ArrayWithPreallocation (ArrayWithPreallocation&& other) noexcept
    {
        if (other.isHeapAllocated())
        {
            items = other.items;
            numActive = other.numActive;
            numAllocated = other.numAllocated;
            other.resetToInternalStorage();
            other.numActive = 0;
        }
        else
        {
            items = getPreallocatedSpace();
            numActive = other.numActive;

            for (size_t i = 0; i < numActive; ++i)
                new (items + i) Item (std::move (other.items[i]));
        }
    }